

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * disconnectnode(void)

{
  initializer_list<RPCArg> __l;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff6e8;
  RPCArg *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff6f0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff6f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff718;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff720;
  allocator<char> *in_stack_fffffffffffff728;
  iterator in_stack_fffffffffffff730;
  undefined1 *puVar2;
  RPCArgOptions *in_stack_fffffffffffff738;
  string *in_stack_fffffffffffff740;
  Fallback *in_stack_fffffffffffff748;
  undefined1 skip_type_check;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff750;
  string *in_stack_fffffffffffff758;
  RPCArg *in_stack_fffffffffffff760;
  RPCResults *in_stack_fffffffffffff768;
  RPCResult *in_stack_fffffffffffff770;
  RPCHelpMan *examples;
  RPCResults *in_stack_fffffffffffff838;
  _Alloc_hider in_stack_fffffffffffff840;
  string *in_stack_fffffffffffff848;
  undefined8 in_stack_fffffffffffff850;
  undefined8 in_stack_fffffffffffff858;
  allocator<char> local_7a0;
  allocator<char> local_79f;
  allocator<char> local_79e;
  allocator<char> local_79d;
  allocator<char> local_79c;
  allocator<char> local_79b;
  allocator<char> local_79a;
  allocator<char> local_799;
  pointer local_798;
  pointer pRStack_790;
  pointer local_788;
  allocator<char> local_772;
  allocator<char> local_771 [27];
  allocator<char> local_756;
  allocator<char> local_755;
  allocator<char> local_754;
  allocator<char> local_753;
  allocator<char> local_752;
  allocator<char> local_751 [31];
  allocator<char> local_732;
  allocator<char> local_731 [129];
  RPCMethodImpl *in_stack_fffffffffffff950;
  undefined1 local_258 [528];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  examples = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::__cxx11::string::string(in_stack_fffffffffffff700);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6e8);
  RPCArg::RPCArg(in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                 (Type)((ulong)in_stack_fffffffffffff750 >> 0x20),in_stack_fffffffffffff748,
                 in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff6f8,in_stack_fffffffffffff6f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::__cxx11::string::string(in_stack_fffffffffffff700);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff6e8);
  RPCArg::RPCArg(in_stack_fffffffffffff760,in_stack_fffffffffffff758,
                 (Type)((ulong)in_stack_fffffffffffff750 >> 0x20),in_stack_fffffffffffff748,
                 in_stack_fffffffffffff740,in_stack_fffffffffffff738);
  skip_type_check = (undefined1)((ulong)in_stack_fffffffffffff748 >> 0x38);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff6e8);
  __l._M_len = (size_type)in_stack_fffffffffffff738;
  __l._M_array = in_stack_fffffffffffff730;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff728,__l,
             (allocator_type *)in_stack_fffffffffffff720);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  local_798 = (pointer)0x0;
  pRStack_790 = (pointer)0x0;
  local_788 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6e8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff770,(Type)((ulong)in_stack_fffffffffffff768 >> 0x20),
             &in_stack_fffffffffffff760->m_names,in_stack_fffffffffffff758,in_stack_fffffffffffff750
             ,(bool)skip_type_check);
  RPCResults::RPCResults(in_stack_fffffffffffff768,(RPCResult *)in_stack_fffffffffffff760);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  HelpExampleCli(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  HelpExampleCli(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  std::operator+(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  HelpExampleRpc(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  std::operator+(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff738,(char *)in_stack_fffffffffffff730,in_stack_fffffffffffff728);
  HelpExampleRpc(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  std::operator+(in_stack_fffffffffffff720,in_stack_fffffffffffff718);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff6e8,(string *)0x134c029);
  this = (RPCArg *)&stack0xfffffffffffff840;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<disconnectnode()::__0,void>
            (in_stack_fffffffffffff6f8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff6f0);
  RPCHelpMan::RPCHelpMan
            ((RPCHelpMan *)in_stack_fffffffffffff858,(string *)in_stack_fffffffffffff850,
             in_stack_fffffffffffff848,
             (vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff840._M_p,
             in_stack_fffffffffffff838,(RPCExamples *)examples,in_stack_fffffffffffff950);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_7a0);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79f);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79e);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79d);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79c);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79b);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_79a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_799);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff6f8);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_772);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_771);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff6f8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_756);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_755);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_754);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_753);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_752);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_751);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_732);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_731);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan disconnectnode()
{
    return RPCHelpMan{"disconnectnode",
                "\nImmediately disconnects from the specified peer node.\n"
                "\nStrictly one out of 'address' and 'nodeid' can be provided to identify the node.\n"
                "\nTo disconnect by nodeid, either set 'address' to the empty string, or call using the named 'nodeid' argument only.\n",
                {
                    {"address", RPCArg::Type::STR, RPCArg::DefaultHint{"fallback to nodeid"}, "The IP address/port of the node"},
                    {"nodeid", RPCArg::Type::NUM, RPCArg::DefaultHint{"fallback to address"}, "The node ID (see getpeerinfo for node IDs)"},
                },
                RPCResult{RPCResult::Type::NONE, "", ""},
                RPCExamples{
                    HelpExampleCli("disconnectnode", "\"192.168.0.6:8333\"")
            + HelpExampleCli("disconnectnode", "\"\" 1")
            + HelpExampleRpc("disconnectnode", "\"192.168.0.6:8333\"")
            + HelpExampleRpc("disconnectnode", "\"\", 1")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    NodeContext& node = EnsureAnyNodeContext(request.context);
    CConnman& connman = EnsureConnman(node);

    bool success;
    const UniValue &address_arg = request.params[0];
    const UniValue &id_arg = request.params[1];

    if (!address_arg.isNull() && id_arg.isNull()) {
        /* handle disconnect-by-address */
        success = connman.DisconnectNode(address_arg.get_str());
    } else if (!id_arg.isNull() && (address_arg.isNull() || (address_arg.isStr() && address_arg.get_str().empty()))) {
        /* handle disconnect-by-id */
        NodeId nodeid = (NodeId) id_arg.getInt<int64_t>();
        success = connman.DisconnectNode(nodeid);
    } else {
        throw JSONRPCError(RPC_INVALID_PARAMS, "Only one of address and nodeid should be provided.");
    }

    if (!success) {
        throw JSONRPCError(RPC_CLIENT_NODE_NOT_CONNECTED, "Node not found in connected nodes");
    }

    return UniValue::VNULL;
},
    };
}